

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc.cpp
# Opt level: O0

void __thiscall Doc::~Doc(Doc *this)

{
  Doc *this_local;
  
  ~Doc(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

Doc::~Doc()
{
	if (_title)
		free(_title);
	if (_body)
		free(_body);
	if (_author)
		free(_author);
}